

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O3

void __thiscall
ParticleTest_GetSetVelocity_Test<pica::Particle<(pica::Dimension)3>_>::TestBody
          (ParticleTest_GetSetVelocity_Test<pica::Particle<(pica::Dimension)3>_> *this)

{
  FP *pFVar1;
  PositionType minPosition;
  PositionType maxPosition;
  bool bVar2;
  char *pcVar3;
  PositionType position_1;
  PositionType position;
  AssertHelper local_a0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 local_78;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_70;
  undefined8 local_68;
  Particle local_58;
  
  local_78 = 0xc024000000000000;
  sStack_70.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc024000000000000;
  local_68 = 0xc024000000000000;
  local_98.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4024000000000000
  ;
  uStack_90 = 0x4024000000000000;
  local_88 = 0x4024000000000000;
  minPosition.y = -10.0;
  minPosition.x = -10.0;
  minPosition.z = -10.0;
  maxPosition.y = 10.0;
  maxPosition.x = 10.0;
  maxPosition.z = 10.0;
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
            (&local_58,(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)this,minPosition,
             maxPosition);
  local_58.p.x = 1.7489317533889174e-07;
  local_58.p.y = -0.00018756309402915045;
  local_58.p.z = -2.176072126121232e-13;
  local_58.invGamma = 0.9999999824100282;
  (this->super_ParticleTest<pica::Particle<(pica::Dimension)3>_>).
  super_BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>.super_BaseFixture.maxRelativeError
       = 1e-12;
  pFVar1 = &(this->super_ParticleTest<pica::Particle<(pica::Dimension)3>_>).
            super_BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>.super_BaseFixture.
            maxAbsoluteError;
  if (5623002.444493814 < *pFVar1 || *pFVar1 == 5623002.444493814) {
    local_98.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &DAT_3e1000007ffffe00;
    testing::internal::CmpHelperLE<double,double>
              ((internal *)&local_78,"dist(newVelocity, particle.getVelocity())",
               "this->maxAbsoluteError",(double *)&local_98,
               &(this->super_ParticleTest<pica::Particle<(pica::Dimension)3>_>).
                super_BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>.super_BaseFixture.
                maxAbsoluteError);
    if (local_78._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (sStack_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((sStack_70.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x97,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_98.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_98.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  else {
    local_98.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &DAT_3ca7de92225a8e1c;
    testing::internal::CmpHelperLE<double,double>
              ((internal *)&local_78,
               "dist(newVelocity, particle.getVelocity()) / newVelocity.norm()",
               "this->maxRelativeError",(double *)&local_98,
               &(this->super_ParticleTest<pica::Particle<(pica::Dimension)3>_>).
                super_BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>.super_BaseFixture.
                maxRelativeError);
    if (local_78._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (sStack_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((sStack_70.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x97,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_98.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_98.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetSetVelocity)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;

    ParticleType particle = this->randomParticle();
    MomentumType newVelocity(5243.1654, -56.23e5, -65.237e-4);
    particle.setVelocity(newVelocity);
    this->maxRelativeError = 1e-12;
    MomentumType v = particle.getVelocity();
    ASSERT_NEAR_VECTOR(newVelocity, particle.getVelocity());
}